

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall glslang::HlslParseContext::~HlslParseContext(HlslParseContext *this)

{
  (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions =
       (_func_int **)&PTR__HlslParseContext_0093bf20;
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
  ::_M_erase((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              *)&this->textureShadowVariant,
             (_Link_type)
             (this->textureShadowVariant).
             super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<glslang::TBuiltInVariable,_std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
  ::_M_erase((_Rb_tree<glslang::TBuiltInVariable,_std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
              *)&this->builtInTessLinkageSymbols,
             (_Link_type)
             (this->builtInTessLinkageSymbols).
             super_map<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>,_glslang::pool_allocator<std::pair<const_glslang::TBuiltInVariable,_glslang::TSymbol_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
  ::_M_erase((_Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
              *)&this->splitBuiltIns,
             (_Link_type)
             (this->splitBuiltIns).
             super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
              *)&this->structBufferCounter,
             (_Link_type)
             (this->structBufferCounter).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_long_long,_glslang::TVariable_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
  ::_M_erase((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_long_long,_glslang::TVariable_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
              *)&this->splitNonIoVars,
             (_Link_type)
             (this->splitNonIoVars).
             super_map<long_long,_glslang::TVariable_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::TVariable_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
  ::_M_erase((_Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              *)&this->ioTypeMap,
             (_Link_type)
             (this->ioTypeMap).
             super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
  ::_M_erase((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              *)&this->flattenMap,
             (_Link_type)
             (this->flattenMap).
             super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::_M_erase(&(this->inductiveLoopIds)._M_t,
             (_Link_type)
             (this->inductiveLoopIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  TParseContextBase::~TParseContextBase(&this->super_TParseContextBase);
  return;
}

Assistant:

HlslParseContext::~HlslParseContext()
{
}